

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledInputFile::getTileOrder(DeepTiledInputFile *this,int *dx,int *dy,int *lx,int *ly)

{
  size_type sVar1;
  exr_lineorder_t eVar2;
  LevelMode LVar3;
  int iVar4;
  int iVar5;
  ArgExc *pAVar6;
  exr_context_t p_Var7;
  element_type *peVar8;
  reference pvVar9;
  Context *in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  undefined4 *in_R8;
  value_type *tp_2;
  size_t i;
  tilepos *tp_1;
  exr_chunk_info_t cinfo_1;
  int x_1;
  int y_1;
  int nX_1;
  int i_lx_1;
  int nY_1;
  int i_ly_1;
  tilepos *tp;
  exr_chunk_info_t cinfo;
  int x;
  int y;
  int nX;
  int nY;
  int i_l_1;
  size_t tIdx;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  table;
  int i_lx;
  int i_ly;
  int i_l;
  int numY;
  int numX;
  size_t numAllTiles;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  *in_stack_fffffffffffffe08;
  __normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos_*,_std::vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>_>
  __last;
  __normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos_*,_std::vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>_>
  in_stack_fffffffffffffe20;
  size_type in_stack_fffffffffffffe28;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  *in_stack_fffffffffffffe30;
  size_type local_150;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  local_130;
  uint64_t local_118;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  reference local_d8;
  vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
  local_d0;
  uint64_t local_b8;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  size_type local_78;
  tilepos local_70;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  int in_stack_ffffffffffffffcc;
  DeepTiledInputFile *in_stack_ffffffffffffffd0;
  
  std::
  __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1ba5e8);
  eVar2 = Context::lineOrder(in_RCX,(int)((ulong)in_R8 >> 0x20));
  switch(eVar2) {
  case EXR_LINEORDER_INCREASING_Y:
    *in_RSI = 0;
    *in_RDX = 0;
    *(undefined4 *)
     &(in_RCX->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         0;
    *in_R8 = 0;
    break;
  case EXR_LINEORDER_DECREASING_Y:
    *in_RSI = 0;
    iVar4 = numYTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    *in_RDX = iVar4 + -1;
    *(undefined4 *)
     &(in_RCX->_ctxt).super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         0;
    *in_R8 = 0;
    break;
  case EXR_LINEORDER_RANDOM_Y:
    local_40 = 0;
    local_44 = numXLevels((DeepTiledInputFile *)0x1ba734);
    local_48 = numYLevels((DeepTiledInputFile *)0x1ba748);
    LVar3 = levelMode((DeepTiledInputFile *)0x1ba75c);
    if (LVar3 < RIPMAP_LEVELS) {
      for (local_4c = 0; local_4c < local_48; local_4c = local_4c + 1) {
        iVar4 = numXTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        iVar5 = numYTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        local_40 = (long)iVar4 * (long)iVar5 + local_40;
      }
    }
    else {
      if (LVar3 != RIPMAP_LEVELS) {
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar6,"Unknown LevelMode format.");
        __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      for (local_50 = 0; local_50 < local_48; local_50 = local_50 + 1) {
        for (local_54 = 0; local_54 < local_44; local_54 = local_54 + 1) {
          iVar4 = numXTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          iVar5 = numYTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          local_40 = (long)iVar4 * (long)iVar5 + local_40;
        }
      }
    }
    std::
    vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
    ::vector((vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
              *)0x1ba925);
    std::
    vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
    ::resize(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    local_78 = 0;
    LVar3 = levelMode((DeepTiledInputFile *)0x1ba952);
    if (LVar3 < RIPMAP_LEVELS) {
      for (local_7c = 0; local_7c < local_48; local_7c = local_7c + 1) {
        local_80 = numYTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        local_84 = numXTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        for (local_88 = 0; local_88 < local_80; local_88 = local_88 + 1) {
          for (local_8c = 0; local_8c < local_84; local_8c = local_8c + 1) {
            p_Var7 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1baa3e);
            peVar8 = std::
                     __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1baa54);
            in_stack_fffffffffffffe08 = &local_d0;
            iVar4 = exr_read_tile_chunk_info(p_Var7,peVar8->partNumber,local_8c,local_88,local_7c);
            sVar1 = local_78;
            if (iVar4 != 0) {
              pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar6,"Unable to get tile offset.");
              __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            local_78 = local_78 + 1;
            local_d8 = std::
                       vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                       ::operator[]((vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                                     *)&local_70,sVar1);
            local_d8->filePos = local_b8;
            local_d8->dx = local_8c;
            local_d8->dy = local_88;
            local_d8->lx = local_7c;
            local_d8->ly = local_7c;
          }
        }
      }
    }
    else {
      if (LVar3 != RIPMAP_LEVELS) {
        pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar6,"Unknown LevelMode format.");
        __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      for (local_dc = 0; local_dc < local_48; local_dc = local_dc + 1) {
        local_e0 = numYTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
        for (local_e4 = 0; local_e4 < local_44; local_e4 = local_e4 + 1) {
          local_e8 = numXTiles(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
          for (local_ec = 0; local_ec < local_e0; local_ec = local_ec + 1) {
            for (local_f0 = 0; local_f0 < local_e8; local_f0 = local_f0 + 1) {
              p_Var7 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x1baca8);
              peVar8 = std::
                       __shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<Imf_3_4::DeepTiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1bacbe);
              in_stack_fffffffffffffe08 = &local_130;
              iVar4 = exr_read_tile_chunk_info
                                (p_Var7,peVar8->partNumber,local_f0,local_ec,local_e4,local_dc);
              sVar1 = local_78;
              if (iVar4 != 0) {
                pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
                Iex_3_4::ArgExc::ArgExc(pAVar6,"Unable to get tile offset.");
                __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
              }
              local_78 = local_78 + 1;
              pvVar9 = std::
                       vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                       ::operator[]((vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                                     *)&local_70,sVar1);
              pvVar9->filePos = local_118;
              pvVar9->dx = local_f0;
              pvVar9->dy = local_ec;
              pvVar9->lx = local_e4;
              pvVar9->ly = local_dc;
            }
          }
        }
      }
    }
    __last._M_current = &local_70;
    std::
    vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
    ::begin(in_stack_fffffffffffffe08);
    std::
    vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
    ::end(in_stack_fffffffffffffe08);
    std::
    sort<__gnu_cxx::__normal_iterator<Imf_3_4::(anonymous_namespace)::tilepos*,std::vector<Imf_3_4::(anonymous_namespace)::tilepos,std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>>>>
              (in_stack_fffffffffffffe20,__last);
    for (local_150 = 0; local_150 < local_40; local_150 = local_150 + 1) {
      pvVar9 = std::
               vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
               ::operator[]((vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
                             *)&local_70,local_150);
      in_RSI[local_150] = pvVar9->dx;
      in_RDX[local_150] = pvVar9->dy;
      *(int *)((long)&(in_RCX->_ctxt).
                      super___shared_ptr<_priv_exr_context_t_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
              local_150 * 4) = pvVar9->lx;
      in_R8[local_150] = pvVar9->ly;
    }
    std::
    vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
    ::~vector((vector<Imf_3_4::(anonymous_namespace)::tilepos,_std::allocator<Imf_3_4::(anonymous_namespace)::tilepos>_>
               *)in_stack_fffffffffffffe20._M_current);
    break;
  case EXR_LINEORDER_LAST_TYPE:
  default:
    pAVar6 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar6,"Unknown LineOrder.");
    __cxa_throw(pAVar6,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  return;
}

Assistant:

void
DeepTiledInputFile::getTileOrder (int dx[], int dy[], int lx[], int ly[]) const
{
    // TODO: remove once TiledOutputFile copy is converted
    switch (_ctxt.lineOrder (_data->partNumber))
    {
        case EXR_LINEORDER_RANDOM_Y:
            // calc below outside the nest
            break;

        case EXR_LINEORDER_DECREASING_Y:
        {
            dx[0] = 0;
            dy[0] = numYTiles (0) - 1;
            lx[0] = 0;
            ly[0] = 0;
            return;
        }
        case EXR_LINEORDER_INCREASING_Y:
            dx[0] = 0;
            dy[0] = 0;
            lx[0] = 0;
            ly[0] = 0;
            return;

        case EXR_LINEORDER_LAST_TYPE: /* invalid but should never be here */
        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LineOrder.");
    }

    size_t numAllTiles = 0;
    int numX = numXLevels ();
    int numY = numYLevels ();

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
                numAllTiles += size_t (numXTiles (i_l)) * size_t (numYTiles (i_l));
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                    numAllTiles += size_t (numXTiles (i_lx)) * size_t (numYTiles (i_ly));
            break;

        default:
            throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::vector<tilepos> table;

    table.resize (numAllTiles);
    size_t tIdx = 0;
    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:
            for (int i_l = 0; i_l < numY; ++i_l)
            {
                int nY = numYTiles (i_l);
                int nX = numXTiles (i_l);

                for ( int y = 0; y < nY; ++y )
                    for ( int x = 0; x < nX; ++x )
                    {
                        exr_chunk_info_t cinfo;
                        if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                _ctxt, _data->partNumber, x, y, i_l, i_l, &cinfo))
                        {
                            tilepos &tp = table[tIdx++];
                            tp.filePos = cinfo.data_offset;
                            tp.dx = x;
                            tp.dy = y;
                            tp.lx = i_l;
                            tp.ly = i_l;
                        }
                        else
                        {
                            throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                        }
                    }
            }
            break;

        case RIPMAP_LEVELS:
            for (int i_ly = 0; i_ly < numY; ++i_ly)
            {
                int nY = numYTiles (i_ly);
                for (int i_lx = 0; i_lx < numX; ++i_lx)
                {
                    int nX = numXTiles (i_lx);
                    for ( int y = 0; y < nY; ++y )
                        for ( int x = 0; x < nX; ++x )
                        {
                            exr_chunk_info_t cinfo;
                            if (EXR_ERR_SUCCESS == exr_read_tile_chunk_info (
                                    _ctxt, _data->partNumber, x, y, i_lx, i_ly, &cinfo))
                            {
                                tilepos &tp = table[tIdx++];
                                tp.filePos = cinfo.data_offset;
                                tp.dx = x;
                                tp.dy = y;
                                tp.lx = i_lx;
                                tp.ly = i_ly;
                            }
                            else
                            {
                                throw IEX_NAMESPACE::ArgExc ("Unable to get tile offset.");
                            }
                        }
                }
            }
            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    std::sort (table.begin(), table.end ());

    for (size_t i = 0; i < numAllTiles; ++i)
    {
        const auto& tp = table[i];
        dx[i] = tp.dx;
        dy[i] = tp.dy;
        lx[i] = tp.lx;
        ly[i] = tp.ly;
    }
}